

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

ostream * __thiscall
trompeloeil::call_matcher<void_(),_std::tuple<>_>::report_mismatch
          (call_matcher<void_(),_std::tuple<>_> *this,ostream *os,
          call_params_type_t<void_()> *params)

{
  int iVar1;
  undefined8 in_RAX;
  char *__s;
  size_t sVar2;
  condition_base<void_()> *cond;
  list_elem<trompeloeil::condition_base<void_()>_> *plVar3;
  undefined8 uStack_38;
  undefined4 extraout_var;
  
  this->reported = true;
  uStack_38 = in_RAX;
  (*(this->super_call_matcher_base<void_()>).
    super_list_elem<trompeloeil::call_matcher_base<void_()>_>._vptr_list_elem[6])();
  plVar3 = (this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>.next;
  if (plVar3 != &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>) {
    do {
      iVar1 = (*plVar3->_vptr_list_elem[2])(plVar3,params);
      if ((char)iVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Failed WITH(",0xf);
        iVar1 = (*plVar3->_vptr_list_elem[3])(plVar3);
        __s = (char *)CONCAT44(extraout_var,iVar1);
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
        }
        uStack_38 = CONCAT17(0x29,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
      }
      plVar3 = plVar3->next;
    } while (plVar3 != &(this->conditions).super_list_elem<trompeloeil::condition_base<void_()>_>);
  }
  return os;
}

Assistant:

std::ostream&
    report_mismatch(
      std::ostream& os,
      call_params_type_t<Sig> const & params)
    override
    {
      reported = true;
      report_signature(os);
      if (match_parameters(val, params))
      {
        for (auto& cond : conditions)
        {
          if (!cond.check(params))
          {
            os << "\n  Failed WITH(" << cond.name() << ')';
          }
        }
      }
      else
      {
        os << '\n';
        ::trompeloeil::print_mismatch(os, val, params);
      }
      return os;
    }